

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O0

int __thiscall Qclass::futurereward(Qclass *this,int new_state)

{
  int local_24;
  double dStack_20;
  int i;
  double currMax;
  int new_state_local;
  Qclass *this_local;
  
  dStack_20 = -100000.0;
  if (new_state < 0x9c4) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      if (dStack_20 < this->Q[new_state][local_24]) {
        dStack_20 = this->Q[new_state][local_24];
      }
    }
  }
  else {
    dStack_20 = -100000.0;
  }
  return (int)dStack_20;
}

Assistant:

int Qclass::futurereward(int new_state) {
  double currMax = -100000;
  if (new_state > 2499) {
    currMax = -100000;
  } else {   // Finds future reward benefits for state,action pair
    for (int i = 0; i < 4; i++) {
      if (Q[new_state][i] > currMax) {
        currMax = Q[new_state][i];
      }
    }
  }
  return currMax;
}